

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O1

EGLContext
eglu::createGLContext
          (Library *egl,EGLDisplay display,EGLContext eglConfig,ContextType *contextType,
          ResetNotificationStrategy resetNotificationStrategy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ResetNotificationStrategy RVar2;
  bool bVar3;
  uint uVar4;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  NotSupportedError *this;
  InternalError *this_00;
  pointer_____offset_0x10___ *ppuVar7;
  undefined8 uVar8;
  vector<int,_std::allocator<int>_> attribList;
  EGLint flags;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  uint local_50;
  ResetNotificationStrategy local_4c;
  EGLDisplay local_48;
  Version local_40;
  Version local_38;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_4c = resetNotificationStrategy;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"EGL_KHR_create_context","");
  bVar3 = hasExtension(egl,display,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  uVar4 = (contextType->super_ApiType).m_bits;
  local_48 = display;
  if ((uVar4 & 0x300) == 0) {
    if ((uVar4 & 0xf) < 3) {
      local_70._M_dataplus._M_p._0_4_ = 0x3098;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,(iterator)0x0,(int *)&local_70);
      uVar4 = (contextType->super_ApiType).m_bits;
      local_70._M_dataplus._M_p =
           (pointer)(CONCAT44(local_70._M_dataplus._M_p._4_4_,uVar4) & 0xffffffff0000000f);
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
LAB_0043b432:
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = uVar4 & 0xf;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((uint *)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_finish + 1);
      }
    }
    else {
      if (!bVar3) {
        this = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this,"EGL_KHR_create_context is required for OpenGL ES 3.0 and newer",(char *)0x0
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0x66);
        goto LAB_0043b8c6;
      }
      local_70._M_dataplus._M_p._0_4_ = 0x3098;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,(iterator)0x0,(int *)&local_70);
      local_70._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits & 0xf;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (uint)local_70._M_dataplus._M_p;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_70._M_dataplus._M_p._0_4_ = 0x30fb;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x30fb;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar4 = (contextType->super_ApiType).m_bits >> 4;
      local_70._M_dataplus._M_p =
           (pointer)(CONCAT44(local_70._M_dataplus._M_p._4_4_,uVar4) & 0xffffffff0000000f);
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_0043b432;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    uVar8 = 0x30a0;
  }
  else {
    if (!bVar3) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"EGL_KHR_create_context is required for OpenGL context creation",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x73);
LAB_0043b8c6:
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_70._M_dataplus._M_p._0_4_ = 0x3098;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_88,(iterator)0x0,(int *)&local_70);
    local_70._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits & 0xf;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = (uint)local_70._M_dataplus._M_p;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_70._M_dataplus._M_p._0_4_ = 0x30fb;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0x30fb;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_70._M_dataplus._M_p._0_4_ = (contextType->super_ApiType).m_bits >> 4 & 0xf;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = (uint)local_70._M_dataplus._M_p;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_70._M_dataplus._M_p._0_4_ = 0x30fd;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0x30fd;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_70._M_dataplus._M_p._0_4_ = (((contextType->super_ApiType).m_bits & 0x300) != 0x100) + 1;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = (uint)local_70._M_dataplus._M_p;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    uVar8 = 0x30a2;
  }
  uVar4 = (contextType->super_ApiType).m_bits;
  if ((uVar4 & 0x1c00) == 0) goto LAB_0043b6ce;
  local_50 = 0;
  if (!bVar3) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,
               "EGL_KHR_create_context is required for creating robust/debug/forward-compatible contexts"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0x85);
LAB_0043b7f4:
    ppuVar7 = &tcu::NotSupportedError::typeinfo;
    goto LAB_0043b88c;
  }
  bVar3 = (uVar4 >> 0xb & 1) != 0;
  local_50 = (uint)bVar3;
  if ((uVar4 >> 10 & 1) != 0) {
    if ((uVar4 & 0x300) == 0) {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"EGL_EXT_create_context_robustness","");
      bVar3 = hasExtension(egl,local_48,&local_70);
      if (bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_40 = getVersion(egl,local_48);
        local_38.m_major = 1;
        local_38.m_minor = 5;
        bVar3 = Version::operator<(&local_40,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    ((NotSupportedError *)this_00,
                     "EGL_EXT_create_context_robustness is required for creating robust context",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                     ,0x8f);
          goto LAB_0043b7f4;
        }
      }
      local_70._M_dataplus._M_p._0_4_ = 0x30bf;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x30bf;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_70._M_dataplus._M_p._0_4_ = 1;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 1;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    else {
      local_50 = (uint)(bVar3 | 4);
    }
  }
  uVar4 = (contextType->super_ApiType).m_bits;
  if ((uVar4 >> 0xc & 1) == 0) {
LAB_0043b5b7:
    local_70._M_dataplus._M_p._0_4_ = 0x30fc;
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_70);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0x30fc;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_88,
                 (iterator)
                 local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_50);
    }
    else {
      *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_50;
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    RVar2 = local_4c;
    if (local_4c == RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED) goto LAB_0043b6ce;
    if (((contextType->super_ApiType).m_bits & 0x300) != 0) {
      local_70._M_dataplus._M_p._0_4_ = 0x31bd;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x31bd;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (RVar2 == RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET) {
        local_70._M_dataplus._M_p._0_4_ = 0x31bf;
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_70);
          goto LAB_0043b6ce;
        }
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x31bf;
      }
      else {
        if (RVar2 != RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION) {
          this_00 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_00,"Unknown reset notification strategy",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                     ,0xaf);
          goto LAB_0043b885;
        }
        local_70._M_dataplus._M_p._0_4_ = 0x31be;
        if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_70);
          goto LAB_0043b6ce;
        }
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x31be;
      }
      local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
LAB_0043b6ce:
      local_70._M_dataplus._M_p._0_4_ = 0x3038;
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_70);
      }
      else {
        *local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x3038;
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      (**egl->_vptr_Library)(egl,uVar8);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      checkError(dVar5,"bindAPI(api)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0xb5);
      iVar6 = (*egl->_vptr_Library[6])
                        (egl,local_48,eglConfig,0,
                         local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      checkError(dVar5,"eglCreateContext()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0xb7);
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return (EGLContext)CONCAT44(extraout_var,iVar6);
    }
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,
               "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts"
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0xa6);
  }
  else {
    if ((uVar4 & 0x300) == 0x100) {
      local_50 = local_50 | 2;
      goto LAB_0043b5b7;
    }
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Only OpenGL core contexts can be forward-compatible",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0x9b);
  }
LAB_0043b885:
  ppuVar7 = &tcu::InternalError::typeinfo;
LAB_0043b88c:
  __cxa_throw(this_00,ppuVar7,tcu::Exception::~Exception);
}

Assistant:

EGLContext createGLContext (const Library&					egl,
							EGLDisplay						display,
							EGLContext						eglConfig,
							const glu::ContextType&			contextType,
							glu::ResetNotificationStrategy	resetNotificationStrategy)
{
	const bool			khrCreateContextSupported	= hasExtension(egl, display, "EGL_KHR_create_context");
	EGLContext			context						= EGL_NO_CONTEXT;
	EGLenum				api							= EGL_NONE;
	vector<EGLint>		attribList;

	if (glu::isContextTypeES(contextType))
	{
		api = EGL_OPENGL_ES_API;

		if (contextType.getMajorVersion() <= 2)
		{
			attribList.push_back(EGL_CONTEXT_CLIENT_VERSION);
			attribList.push_back(contextType.getMajorVersion());
		}
		else
		{
			if (!khrCreateContextSupported)
				TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for OpenGL ES 3.0 and newer");

			attribList.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
			attribList.push_back(contextType.getMajorVersion());
			attribList.push_back(EGL_CONTEXT_MINOR_VERSION_KHR);
			attribList.push_back(contextType.getMinorVersion());
		}
	}
	else
	{
		DE_ASSERT(glu::isContextTypeGLCore(contextType) || glu::isContextTypeGLCompatibility(contextType));

		if (!khrCreateContextSupported)
			TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for OpenGL context creation");

		api = EGL_OPENGL_API;

		attribList.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
		attribList.push_back(contextType.getMajorVersion());
		attribList.push_back(EGL_CONTEXT_MINOR_VERSION_KHR);
		attribList.push_back(contextType.getMinorVersion());
		attribList.push_back(EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR);
		attribList.push_back(glu::isContextTypeGLCore(contextType) ? EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR
																   : EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR);
	}

	if (contextType.getFlags() != glu::ContextFlags(0))
	{
		EGLint flags = 0;

		if (!khrCreateContextSupported)
			TCU_THROW(NotSupportedError, "EGL_KHR_create_context is required for creating robust/debug/forward-compatible contexts");

		if ((contextType.getFlags() & glu::CONTEXT_DEBUG) != 0)
			flags |= EGL_CONTEXT_OPENGL_DEBUG_BIT_KHR;

		if ((contextType.getFlags() & glu::CONTEXT_ROBUST) != 0)
		{
			if (glu::isContextTypeES(contextType))
			{
				if (!hasExtension(egl, display, "EGL_EXT_create_context_robustness") && (getVersion(egl, display) < Version(1, 5)))
					TCU_THROW(NotSupportedError, "EGL_EXT_create_context_robustness is required for creating robust context");

				attribList.push_back(EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT);
				attribList.push_back(EGL_TRUE);
			}
			else
				flags |= EGL_CONTEXT_OPENGL_ROBUST_ACCESS_BIT_KHR;
		}

		if ((contextType.getFlags() & glu::CONTEXT_FORWARD_COMPATIBLE) != 0)
		{
			if (!glu::isContextTypeGLCore(contextType))
				TCU_THROW(InternalError, "Only OpenGL core contexts can be forward-compatible");

			flags |= EGL_CONTEXT_OPENGL_FORWARD_COMPATIBLE_BIT_KHR;
		}

		attribList.push_back(EGL_CONTEXT_FLAGS_KHR);
		attribList.push_back(flags);

		if (resetNotificationStrategy != glu::RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED)
		{
			if (glu::isContextTypeES(contextType))
				TCU_THROW(InternalError, "Specifying reset notification strategy is not allowed when creating OpenGL ES contexts");

			attribList.push_back(EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_KHR);

			if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION)
				attribList.push_back(EGL_NO_RESET_NOTIFICATION_KHR);
			else if (resetNotificationStrategy == glu::RESET_NOTIFICATION_STRATEGY_LOSE_CONTEXT_ON_RESET)
				attribList.push_back(EGL_LOSE_CONTEXT_ON_RESET_KHR);
			else
				TCU_THROW(InternalError, "Unknown reset notification strategy");
		}
	}

	attribList.push_back(EGL_NONE);

	EGLU_CHECK_CALL(egl, bindAPI(api));
	context = egl.createContext(display, eglConfig, EGL_NO_CONTEXT, &(attribList[0]));
	EGLU_CHECK_MSG(egl, "eglCreateContext()");

	return context;
}